

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O3

Action __thiscall
psy::C::TypeChecker::visitBinaryExpression_MultiplicationOrDivision<psy::C::BinaryExpressionSyntax>
          (TypeChecker *this,BinaryExpressionSyntax *node,Type *leftTy,Type *rightTy)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Type *pTVar4;
  Action AVar5;
  
  iVar2 = (*(node->super_ExpressionSyntax).super_SyntaxNode.super_Managed._vptr_Managed[0xd9])(node)
  ;
  bVar1 = satisfyArithmeticTypeConstraint(this,leftTy,(SyntaxNode *)CONCAT44(extraout_var,iVar2));
  AVar5 = Quit;
  if (bVar1) {
    iVar2 = (*(node->super_ExpressionSyntax).super_SyntaxNode.super_Managed._vptr_Managed[0xdb])
                      (node);
    bVar1 = satisfyArithmeticTypeConstraint
                      (this,rightTy,(SyntaxNode *)CONCAT44(extraout_var_00,iVar2));
    if (bVar1) {
      iVar2 = (*leftTy->_vptr_Type[5])(leftTy);
      iVar3 = (*rightTy->_vptr_Type[5])(rightTy);
      pTVar4 = &determineCommonRealType
                          (this,(BasicType *)CONCAT44(extraout_var_01,iVar2),
                           (BasicType *)CONCAT44(extraout_var_02,iVar3))->super_Type;
      this->ty_ = pTVar4;
      AVar5 = Skip;
    }
  }
  return AVar5;
}

Assistant:

SyntaxVisitor::Action TypeChecker::visitBinaryExpression_MultiplicationOrDivision(
        const BinaryLikeExprNodeT* node,
        const Type* leftTy,
        const Type* rightTy)
{
    if (!(satisfyArithmeticTypeConstraint(leftTy, node->left())
            && satisfyArithmeticTypeConstraint(rightTy, node->right()))) {
        return Action::Quit;
    }
    ty_ = determineCommonRealType(leftTy->asBasicType(), rightTy->asBasicType());

    return Action::Skip;
}